

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quat4f.cpp
# Opt level: O2

Quat4f Quat4f::randomRotation(float u0,float u1,float u2)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 (*in_RDI) [16];
  float fVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [32];
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_YMM0_H;
  undefined1 in_register_00001204 [60];
  undefined1 auVar13 [64];
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined8 extraout_var_00;
  undefined1 auVar14 [64];
  Quat4f QVar15;
  undefined1 extraout_var [56];
  
  auVar13._4_60_ = in_register_00001204;
  auVar13._0_4_ = u0;
  auVar4 = vfnmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),auVar13._0_16_,auVar13._0_16_);
  if (auVar4._0_4_ < 0.0) {
    fVar6 = sqrtf(auVar4._0_4_);
  }
  else {
    auVar4 = vsqrtss_avx(auVar4,auVar4);
    fVar6 = auVar4._0_4_;
  }
  dVar7 = (double)(u2 * 3.1415927);
  dVar8 = cos(dVar7);
  dVar9 = sin(dVar7);
  dVar10 = cos((double)(u1 * 6.2831855));
  dVar11 = sin(dVar7);
  auVar14._0_8_ = sin((double)(u1 * 6.2831855));
  auVar14._8_56_ = extraout_var;
  auVar2._8_8_ = extraout_XMM0_Qb_01;
  auVar2._0_8_ = dVar10;
  auVar5._8_8_ = extraout_XMM0_Qb_00;
  auVar5._0_8_ = dVar9;
  auVar4._8_8_ = extraout_XMM0_Qb_02;
  auVar4._0_8_ = dVar11;
  auVar4 = vunpcklpd_avx(auVar5,auVar4);
  auVar2 = vunpcklpd_avx(auVar2,auVar14._0_16_);
  dVar7 = sin(dVar7);
  dVar7 = dVar7 * (double)u0;
  auVar3 = vpermpd_avx2(ZEXT1632(CONCAT88(auVar4._8_8_ * auVar2._8_8_ * (double)fVar6,
                                          auVar4._0_8_ * auVar2._0_8_ * (double)fVar6)),0xd0);
  auVar1._8_8_ = extraout_XMM0_Qb;
  auVar1._0_8_ = dVar8;
  auVar1._16_8_ = extraout_YMM0_H;
  auVar1._24_8_ = extraout_var_00;
  auVar3 = vblendpd_avx(auVar3,auVar1,1);
  auVar12._8_8_ = dVar7;
  auVar12._0_8_ = dVar7;
  auVar12._16_8_ = dVar7;
  auVar12._24_8_ = dVar7;
  auVar1 = vblendpd_avx(auVar3,auVar12,8);
  auVar4 = vcvtpd2ps_avx(auVar1);
  *in_RDI = auVar4;
  QVar15.m_elements._0_8_ = auVar4._0_8_;
  QVar15.m_elements._8_8_ = auVar3._0_8_;
  return (Quat4f)QVar15.m_elements;
}

Assistant:

Quat4f Quat4f::randomRotation( float u0, float u1, float u2 )
{
	float z = u0;
	float theta = static_cast< float >( 2.f * M_PI * u1 );
	float r = sqrt( 1.f - z * z );
	float w = static_cast< float >( M_PI * u2 );

	return Quat4f
	(
		cos( w ),
		sin( w ) * cos( theta ) * r,
		sin( w ) * sin( theta ) * r,
		sin( w ) * z
	);
}